

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecal.cpp
# Opt level: O3

int32_t icu_63::CECalendar::ceToJD(int32_t year,int32_t month,int32_t date,int32_t jdEpochOffset)

{
  uint uVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  
  if (month < 0) {
    uVar4 = ~month;
    uVar1 = ~(uVar4 / 0xd);
    iVar3 = ((uVar4 / 0xd + (uVar4 / 0xd) * 0xc) - uVar4) + 0xc;
  }
  else {
    uVar1 = (uint)month / 0xd;
    iVar3 = month - ((uint)month / 0xd + ((uint)month / 0xd) * 0xc);
  }
  iVar2 = ClockMath::floorDivide(uVar1 + year,4);
  return (uVar1 + year) * 0x16d + date + jdEpochOffset + iVar2 + iVar3 * 0x1e + -1;
}

Assistant:

int32_t
CECalendar::ceToJD(int32_t year, int32_t month, int32_t date, int32_t jdEpochOffset)
{
    // handle month > 12, < 0 (e.g. from add/set)
    if ( month >= 0 ) {
        year += month/13;
        month %= 13;
    } else {
        ++month;
        year += month/13 - 1;
        month = month%13 + 12;
    }
    return (int32_t) (
        jdEpochOffset                   // difference from Julian epoch to 1,1,1
        + 365 * year                    // number of days from years
        + ClockMath::floorDivide(year, 4)    // extra day of leap year
        + 30 * month                    // number of days from months (months are 0-based)
        + date - 1                      // number of days for present month (1 based)
        );
}